

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O2

vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_> * __thiscall
dg::vr::StructureAnalyzer::getBorderValuesFor(StructureAnalyzer *this,Function *func)

{
  const_iterator cVar1;
  Function *local_8;
  
  local_8 = func;
  cVar1 = std::
          _Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>_>,_std::_Select1st<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>_>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>_>_>_>
          ::find((_Rb_tree<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>_>,_std::_Select1st<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>_>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>_>_>_>
                  *)(this + 0x130),&local_8);
  return (vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_> *)
         &cVar1._M_node[1]._M_parent;
}

Assistant:

const std::vector<BorderValue> &
StructureAnalyzer::getBorderValuesFor(const llvm::Function *func) const {
    assert(hasBorderValues(func));
    return borderValues.find(func)->second;
}